

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

rnndelem * trydelem(rnndb *db,char *file,xmlNode *node)

{
  xmlChar *pxVar1;
  xmlAttr *attr;
  rnndb *prVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  rnndelem *prVar7;
  rnndelem **__ptr;
  long lVar8;
  rnndelem *prVar9;
  uint64_t uVar10;
  char *pcVar11;
  xmlNode *node_00;
  xmlNode *node_01;
  rnnetype rVar12;
  _xmlAttr *p_Var13;
  _xmlNode *p_Var14;
  bool bVar15;
  char *local_60;
  
  pxVar1 = node->name;
  iVar4 = strcmp((char *)pxVar1,"use-group");
  if (iVar4 == 0) {
    prVar9 = (rnndelem *)calloc(0x108,1);
    prVar9->file = file;
    prVar9->type = RNN_ETYPE_USE_GROUP;
    p_Var13 = node->properties;
    local_60 = "%s:%d: nameless use-group\n";
    if (p_Var13 != (_xmlAttr *)0x0) {
      pcVar11 = (char *)0x0;
      do {
        pxVar1 = p_Var13->name;
        iVar4 = strcmp((char *)pxVar1,"name");
        if (iVar4 == 0) {
          pcVar11 = getattrib(db,file,(uint)node->line,p_Var13);
          pcVar11 = strdup(pcVar11);
          prVar9->name = pcVar11;
        }
        else {
          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,(ulong)node->line,pxVar1,
                  node->name);
          db->estatus = 1;
        }
        p_Var13 = p_Var13->next;
      } while (p_Var13 != (_xmlAttr *)0x0);
      if (pcVar11 != (char *)0x0) {
        return prVar9;
      }
    }
LAB_001068ff:
    prVar9 = (rnndelem *)0x0;
    fprintf(_stderr,local_60,file,(ulong)node->line);
    db->estatus = 1;
  }
  else {
    iVar4 = strcmp((char *)pxVar1,"stripe");
    if (iVar4 == 0) {
      rVar12 = RNN_ETYPE_STRIPE;
    }
    else {
      iVar5 = strcmp((char *)pxVar1,"array");
      if (iVar5 != 0) {
        iVar4 = strcmp((char *)pxVar1,"reg8");
        if (iVar4 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = strcmp((char *)pxVar1,"reg16");
          if (iVar4 == 0) {
            iVar4 = 0x10;
          }
          else {
            iVar4 = strcmp((char *)pxVar1,"reg32");
            if (iVar4 == 0) {
              iVar4 = 0x20;
            }
            else {
              iVar4 = strcmp((char *)pxVar1,"reg64");
              if (iVar4 != 0) {
                return (rnndelem *)0x0;
              }
              iVar4 = 0x40;
            }
          }
        }
        prVar9 = (rnndelem *)calloc(0x108,1);
        prVar9->file = file;
        prVar9->width = iVar4;
        prVar9->length = 1;
        prVar9->access = RNN_ACCESS_RW;
        p_Var13 = node->properties;
        if (p_Var13 != (_xmlAttr *)0x0) {
          do {
            pxVar1 = p_Var13->name;
            iVar4 = strcmp((char *)pxVar1,"name");
            if (iVar4 == 0) {
              pcVar11 = getattrib(db,file,(uint)node->line,p_Var13);
              pcVar11 = strdup(pcVar11);
              prVar9->name = pcVar11;
            }
            else {
              iVar4 = strcmp((char *)pxVar1,"offset");
              if (iVar4 == 0) {
                uVar10 = getnumattrib(db,file,(uint)node->line,p_Var13);
                prVar9->offset = uVar10;
              }
              else {
                iVar4 = strcmp((char *)pxVar1,"length");
                if (iVar4 == 0) {
                  uVar10 = getnumattrib(db,file,(uint)node->line,p_Var13);
                  prVar9->length = uVar10;
                }
                else {
                  iVar4 = strcmp((char *)pxVar1,"stride");
                  if (iVar4 == 0) {
                    uVar10 = getnumattrib(db,file,(uint)node->line,p_Var13);
                    prVar9->stride = uVar10;
                  }
                  else {
                    iVar4 = strcmp((char *)pxVar1,"varset");
                    if (iVar4 == 0) {
                      pcVar11 = getattrib(db,file,(uint)node->line,p_Var13);
                      pcVar11 = strdup(pcVar11);
                      (prVar9->varinfo).varsetstr = pcVar11;
                    }
                    else {
                      iVar4 = strcmp((char *)pxVar1,"variants");
                      if (iVar4 == 0) {
                        pcVar11 = getattrib(db,file,(uint)node->line,p_Var13);
                        pcVar11 = strdup(pcVar11);
                        (prVar9->varinfo).variantsstr = pcVar11;
                      }
                      else {
                        iVar4 = strcmp((char *)pxVar1,"access");
                        if (iVar4 == 0) {
                          pcVar11 = getattrib(db,file,(uint)node->line,p_Var13);
                          if (*pcVar11 == 'w') {
                            if (pcVar11[1] != '\0') goto LAB_00106827;
                            prVar9->access = RNN_ACCESS_W;
                          }
                          else if (*pcVar11 == 'r') {
                            if (pcVar11[1] == '\0') {
                              prVar9->access = RNN_ACCESS_R;
                            }
                            else {
                              if ((pcVar11[1] != 'w') || (pcVar11[2] != '\0')) goto LAB_00106827;
                              prVar9->access = RNN_ACCESS_RW;
                            }
                          }
                          else {
LAB_00106827:
                            fprintf(_stderr,"%s:%d: wrong access type \"%s\" for register\n",file,
                                    (ulong)node->line,pcVar11);
                          }
                        }
                        else {
                          iVar4 = trytypeattr(db,file,node,p_Var13,&prVar9->typeinfo);
                          if (iVar4 == 0) {
                            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for register\n",file,
                                    (ulong)node->line,p_Var13->name);
                            db->estatus = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            p_Var13 = p_Var13->next;
          } while (p_Var13 != (_xmlAttr *)0x0);
        }
        p_Var14 = node->children;
        if (p_Var14 != (_xmlNode *)0x0) {
          do {
            if (((p_Var14->type == XML_ELEMENT_NODE) &&
                (iVar4 = trytypetag(db,file,p_Var14,&prVar9->typeinfo), iVar4 == 0)) &&
               (pcVar11 = file, iVar4 = trytop(db,file,p_Var14), iVar4 == 0)) {
              prVar2 = (rnndb *)p_Var14->name;
              iVar4 = trydoc(prVar2,pcVar11,node_01);
              if (iVar4 == 0) {
                fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)p_Var14->line,
                        node->name,prVar2);
                db->estatus = 1;
              }
            }
            p_Var14 = p_Var14->next;
          } while (p_Var14 != (_xmlNode *)0x0);
        }
        if (prVar9->name != (char *)0x0) {
          return prVar9;
        }
        local_60 = "%s:%d: nameless register\n";
        goto LAB_001068ff;
      }
      rVar12 = RNN_ETYPE_ARRAY;
    }
    prVar9 = (rnndelem *)calloc(0x108,1);
    prVar9->type = rVar12;
    prVar9->length = 1;
    prVar9->file = file;
    for (attr = node->properties; attr != (xmlAttr *)0x0; attr = attr->next) {
      pxVar1 = attr->name;
      iVar5 = strcmp((char *)pxVar1,"name");
      if (iVar5 == 0) {
        pcVar11 = getattrib(db,file,(uint)node->line,attr);
        pcVar11 = strdup(pcVar11);
        prVar9->name = pcVar11;
      }
      else {
        iVar5 = strcmp((char *)pxVar1,"offset");
        if (iVar5 == 0) {
          uVar10 = getnumattrib(db,file,(uint)node->line,attr);
          prVar9->offset = uVar10;
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"length");
          if (iVar5 == 0) {
            uVar10 = getnumattrib(db,file,(uint)node->line,attr);
            prVar9->length = uVar10;
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"stride");
            if (iVar5 == 0) {
              uVar10 = getnumattrib(db,file,(uint)node->line,attr);
              prVar9->stride = uVar10;
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"prefix");
              if (iVar5 == 0) {
                pcVar11 = getattrib(db,file,(uint)node->line,attr);
                pcVar11 = strdup(pcVar11);
                (prVar9->varinfo).prefixstr = pcVar11;
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"varset");
                if (iVar5 == 0) {
                  pcVar11 = getattrib(db,file,(uint)node->line,attr);
                  pcVar11 = strdup(pcVar11);
                  (prVar9->varinfo).varsetstr = pcVar11;
                }
                else {
                  iVar5 = strcmp((char *)pxVar1,"variants");
                  if (iVar5 == 0) {
                    pcVar11 = getattrib(db,file,(uint)node->line,attr);
                    pcVar11 = strdup(pcVar11);
                    (prVar9->varinfo).variantsstr = pcVar11;
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,(ulong)node->line,
                            pxVar1,node->name);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
      }
    }
    p_Var14 = node->children;
    if (p_Var14 != (_xmlNode *)0x0) {
      __ptr = (rnndelem **)0x0;
      iVar3 = 0;
      iVar5 = 0;
      do {
        if (p_Var14->type == XML_ELEMENT_NODE) {
          prVar7 = trydelem(db,file,p_Var14);
          if (prVar7 == (rnndelem *)0x0) {
            pcVar11 = file;
            iVar6 = trytop(db,file,p_Var14);
            if (iVar6 == 0) {
              prVar2 = (rnndb *)p_Var14->name;
              iVar6 = trydoc(prVar2,pcVar11,node_00);
              if (iVar6 == 0) {
                fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)p_Var14->line,
                        node->name,prVar2);
                db->estatus = 1;
              }
            }
          }
          else {
            if (iVar3 <= iVar5) {
              bVar15 = iVar3 == 0;
              iVar3 = iVar3 * 2;
              if (bVar15) {
                iVar3 = 0x10;
              }
              prVar9->subelemsmax = iVar3;
              __ptr = (rnndelem **)realloc(__ptr,(long)iVar3 << 3);
              prVar9->subelems = __ptr;
            }
            lVar8 = (long)iVar5;
            iVar5 = iVar5 + 1;
            prVar9->subelemsnum = iVar5;
            __ptr[lVar8] = prVar7;
          }
        }
        p_Var14 = p_Var14->next;
      } while (p_Var14 != (_xmlNode *)0x0);
    }
    if ((iVar4 != 0) && (prVar9->stride == 0)) {
      trydelem_cold_1();
    }
  }
  return prVar9;
}

Assistant:

static struct rnndelem *trydelem(struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "use-group")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->file = file;
		res->type = RNN_ETYPE_USE_GROUP;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!res->name) {
			fprintf (stderr, "%s:%d: nameless use-group\n", file, node->line);
			db->estatus = 1;
			return 0;
		}
		return res;
	} else if (!strcmp(node->name, "stripe") || !strcmp(node->name, "array")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->type = (strcmp(node->name, "stripe")?RNN_ETYPE_ARRAY:RNN_ETYPE_STRIPE);
		res->length = 1;
		res->file = file;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "offset")) {
				res->offset = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "length")) {
				res->length = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "stride")) {
				res->stride = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "prefix")) {
				res->varinfo.prefixstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "varset")) {
				res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "variants")) {
				res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		xmlNode *chain = node->children;
		while (chain) {
			struct rnndelem *delem;
			if (chain->type != XML_ELEMENT_NODE) {
			} else if ((delem = trydelem(db, file, chain))) {
				ADDARRAY(res->subelems, delem);
			} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
				fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
				db->estatus = 1;
			}
			chain = chain->next;
		}

		/* Sanity checking */
		if (res->type == RNN_ETYPE_ARRAY && res->stride == 0) {
			fprintf(stderr, "%s: Array %s's stride is undefined. Aborting.\n", file, res->name);
			exit(-1);
		}
		return res;

	}
	int width;
	if (!strcmp(node->name, "reg8"))
		width = 8;
	else if (!strcmp(node->name, "reg16"))
		width = 16;
	else if (!strcmp(node->name, "reg32"))
		width = 32;
	else if (!strcmp(node->name, "reg64"))
		width = 64;
	else
		return 0;
	struct rnndelem *res = calloc(sizeof *res, 1);
	res->file = file;
	res->type = RNN_ETYPE_REG;
	res->width = width;
	res->length = 1;
	res->access = RNN_ACCESS_RW;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			res->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "offset")) {
			res->offset = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "length")) {
			res->length = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "stride")) {
			res->stride = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "varset")) {
			res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "access")) {
			char *str = getattrib(db, file, node->line, attr);
			if (!strcmp(str, "r"))
				res->access = RNN_ACCESS_R;
			else if (!strcmp(str, "w"))
				res->access = RNN_ACCESS_W;
			else if (!strcmp(str, "rw"))
				res->access = RNN_ACCESS_RW;
			else
				fprintf (stderr, "%s:%d: wrong access type \"%s\" for register\n", file, node->line, str);
		} else if (!trytypeattr(db, file, node, attr, &res->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for register\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &res->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!res->name) {
		fprintf (stderr, "%s:%d: nameless register\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
	}
	return res;
}